

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O1

void __thiscall
wabt::OptionParser::OptionParser(OptionParser *this,char *program_name,char *description)

{
  allocator local_1a;
  allocator local_19;
  
  std::__cxx11::string::string((string *)this,program_name,&local_1a);
  std::__cxx11::string::string((string *)&this->description_,description,&local_19);
  *(undefined8 *)&(this->on_error_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->on_error_).super__Function_base._M_functor + 8) = 0;
  (this->on_error_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->on_error_)._M_invoker = (_Invoker_type)0x0;
  (this->arguments_).
  super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->arguments_).
  super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->options_).
  super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->arguments_).
  super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->options_).
  super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->options_).
  super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(OptionParser **)&(this->on_error_).super__Function_base._M_functor = this;
  (this->on_error_)._M_invoker =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/option-parser.cc:52:17)>
       ::_M_invoke;
  (this->on_error_).super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/option-parser.cc:52:17)>
       ::_M_manager;
  return;
}

Assistant:

OptionParser::OptionParser(const char* program_name, const char* description)
    : program_name_(program_name),
      description_(description),
      on_error_([this](const std::string& message) { DefaultError(message); }) {
}